

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

double __thiscall tetgenmesh::incircle3d(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  double dVar1;
  double r;
  double c [3];
  double n2 [3];
  double n1 [3];
  double local_a0;
  tetgenmesh *local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_98 = this;
  facenormal(this,pa,pb,pc,&local_48,1,(double *)0x0);
  local_90 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  facenormal(this,pb,pa,pd,&local_68,1,(double *)0x0);
  dVar1 = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
  if (local_90 <= dVar1) {
    if (dVar1 <= 0.0) {
      return 0.0;
    }
    circumsphere(this,pb,pa,pd,(double *)0x0,&local_88,&local_a0);
    dVar1 = (*pc - local_88) * (*pc - local_88) + (pc[1] - local_80) * (pc[1] - local_80);
    pd = pc;
  }
  else {
    circumsphere(this,pa,pb,pc,(double *)0x0,&local_88,&local_a0);
    dVar1 = (*pd - local_88) * (*pd - local_88) + (pd[1] - local_80) * (pd[1] - local_80);
  }
  dVar1 = (pd[2] - local_78) * (pd[2] - local_78) + dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  return (double)(~-(ulong)(ABS(dVar1 - local_a0) / local_a0 < local_98->b->epsilon) &
                 (ulong)(dVar1 - local_a0));
}

Assistant:

REAL tetgenmesh::incircle3d(point pa, point pb, point pc, point pd)
{
  REAL area2[2], n1[3], n2[3], c[3];
  REAL sign, r, d;

  // Calculate the areas of the two triangles [a, b, c] and [b, a, d].
  facenormal(pa, pb, pc, n1, 1, NULL);
  area2[0] = dot(n1, n1);
  facenormal(pb, pa, pd, n2, 1, NULL);
  area2[1] = dot(n2, n2);

  if (area2[0] > area2[1]) {
    // Choose [a, b, c] as the base triangle.
    circumsphere(pa, pb, pc, NULL, c, &r);
    d = distance(c, pd);
  } else {
    // Choose [b, a, d] as the base triangle.
    if (area2[1] > 0) {
      circumsphere(pb, pa, pd, NULL, c, &r);
      d = distance(c, pc);
    } else {
      // The four points are collinear. This case only happens on the boundary.
      return 0; // Return "not inside".
    }
  }

  sign = d - r;
  if (fabs(sign) / r < b->epsilon) {
    sign = 0;
  }

  return sign;
}